

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_c14n(void)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  xmlDocPtr pxVar5;
  long lVar6;
  int n_compression;
  ulong uVar7;
  ulong uVar8;
  int n_doc;
  uint uVar9;
  undefined4 uVar10;
  ulong in_RSI;
  undefined *puVar11;
  int n_with_comments;
  uint uVar12;
  undefined4 uVar13;
  undefined4 *puVar14;
  ulong uVar15;
  uint uVar16;
  int test_ret;
  int test_ret_2;
  int test_ret_1;
  uint local_54;
  int local_44;
  int local_40;
  int local_3c;
  
  if (quiet == '\0') {
    puts("Testing c14n : 3 of 4 functions ...");
  }
  local_44 = 0;
  uVar9 = 0;
  do {
    uVar16 = 0;
    do {
      uVar12 = 0;
      puVar14 = &DAT_0015fd28;
      do {
        iVar2 = (int)in_RSI;
        iVar1 = xmlMemBlocks();
        pxVar5 = gen_xmlDocPtr(uVar9,iVar2);
        uVar10 = 0xffffffff;
        uVar13 = 0xffffffff;
        if (uVar16 < 4) {
          uVar13 = (&DAT_0015fd28)[uVar16];
        }
        if (uVar12 < 4) {
          uVar10 = *puVar14;
        }
        in_RSI = 0;
        xmlC14NDocDumpMemory(pxVar5,0,uVar13,0,uVar10,0);
        call_tests = call_tests + 1;
        if (((pxVar5 != (xmlDocPtr)0x0) && (api_doc != pxVar5)) && (pxVar5->doc != api_doc)) {
          xmlFreeDoc(pxVar5);
        }
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlC14NDocDumpMemory",(ulong)(uint)(iVar2 - iVar1));
          local_44 = local_44 + 1;
          printf(" %d",(ulong)uVar9);
          printf(" %d",0);
          printf(" %d",(ulong)uVar16);
          printf(" %d",0);
          printf(" %d");
          in_RSI = 0;
          printf(" %d");
          putchar(10);
        }
        uVar12 = uVar12 + 1;
        puVar14 = puVar14 + 1;
      } while (uVar12 != 4);
      uVar16 = uVar16 + 1;
    } while (uVar16 != 4);
    uVar9 = uVar9 + 1;
  } while (uVar9 != 4);
  function_tests = function_tests + 1;
  local_3c = 0;
  local_54 = 0;
  do {
    uVar9 = 0;
    do {
      uVar8 = 0;
      do {
        uVar15 = 0;
        do {
          uVar7 = 0;
          puVar14 = &DAT_0015fd28;
          do {
            iVar2 = (int)in_RSI;
            iVar1 = xmlMemBlocks();
            pxVar5 = gen_xmlDocPtr(local_54,iVar2);
            uVar10 = 0xffffffff;
            uVar13 = 0xffffffff;
            if (uVar9 < 4) {
              uVar13 = (&DAT_0015fd28)[uVar9];
            }
            if ((uint)uVar8 < 4) {
              uVar10 = (&DAT_0015fd28)[uVar8];
            }
            if ((uint)uVar15 < 5) {
              puVar11 = (&PTR_anon_var_dwarf_62f_00162d28)[uVar15];
            }
            else {
              puVar11 = (undefined *)0x0;
            }
            uVar3 = 0xffffffff;
            uVar16 = (uint)uVar7;
            if (uVar16 < 4) {
              uVar3 = *puVar14;
            }
            in_RSI = 0;
            xmlC14NDocSave(pxVar5,0,uVar13,0,uVar10,puVar11,uVar3);
            call_tests = call_tests + 1;
            if (((pxVar5 != (xmlDocPtr)0x0) && (api_doc != pxVar5)) && (pxVar5->doc != api_doc)) {
              xmlFreeDoc(pxVar5);
            }
            xmlResetLastError();
            iVar2 = xmlMemBlocks();
            if (iVar1 != iVar2) {
              iVar2 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlC14NDocSave",(ulong)(uint)(iVar2 - iVar1));
              local_3c = local_3c + 1;
              printf(" %d",(ulong)local_54);
              printf(" %d",0);
              printf(" %d",(ulong)uVar9);
              printf(" %d",0);
              printf(" %d",uVar8);
              printf(" %d",uVar15);
              printf(" %d");
              putchar(10);
              in_RSI = uVar7;
            }
            uVar16 = uVar16 + 1;
            uVar7 = (ulong)uVar16;
            puVar14 = puVar14 + 1;
          } while (uVar16 != 4);
          uVar16 = (uint)uVar15 + 1;
          uVar15 = (ulong)uVar16;
        } while (uVar16 != 6);
        uVar16 = (uint)uVar8 + 1;
        uVar8 = (ulong)uVar16;
      } while (uVar16 != 4);
      uVar9 = uVar9 + 1;
    } while (uVar9 != 4);
    local_54 = local_54 + 1;
  } while (local_54 != 4);
  function_tests = function_tests + 1;
  local_40 = 0;
  local_54 = 0;
  do {
    uVar9 = 0;
    do {
      uVar16 = 0;
      do {
        uVar8 = 0;
        do {
          iVar2 = (int)in_RSI;
          iVar1 = xmlMemBlocks();
          pxVar5 = gen_xmlDocPtr(local_54,iVar2);
          uVar10 = 0xffffffff;
          uVar13 = 0xffffffff;
          if (uVar9 < 4) {
            uVar13 = (&DAT_0015fd28)[uVar9];
          }
          if (uVar16 < 4) {
            uVar10 = (&DAT_0015fd28)[uVar16];
          }
          iVar2 = (int)uVar8;
          if (iVar2 == 0) {
            lVar6 = xmlOutputBufferCreateFilename("test.out",0,0);
          }
          else {
            lVar6 = 0;
          }
          in_RSI = 0;
          xmlC14NDocSaveTo(pxVar5,0,uVar13,0,uVar10,lVar6);
          call_tests = call_tests + 1;
          if (((pxVar5 != (xmlDocPtr)0x0) && (api_doc != pxVar5)) && (pxVar5->doc != api_doc)) {
            xmlFreeDoc(pxVar5);
          }
          if (lVar6 != 0) {
            xmlOutputBufferClose(lVar6);
          }
          xmlResetLastError();
          iVar4 = xmlMemBlocks();
          if (iVar1 != iVar4) {
            iVar4 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlC14NDocSaveTo",(ulong)(uint)(iVar4 - iVar1));
            local_40 = local_40 + 1;
            printf(" %d",(ulong)local_54);
            printf(" %d",0);
            printf(" %d",(ulong)uVar9);
            printf(" %d",0);
            printf(" %d",(ulong)uVar16);
            printf(" %d");
            putchar(10);
            in_RSI = uVar8;
          }
          uVar12 = iVar2 + 1;
          uVar8 = (ulong)uVar12;
        } while (uVar12 == 1);
        uVar16 = uVar16 + 1;
      } while (uVar16 != 4);
      uVar9 = uVar9 + 1;
    } while (uVar9 != 4);
    local_54 = local_54 + 1;
  } while (local_54 != 4);
  function_tests = function_tests + 1;
  uVar9 = local_3c + local_44 + local_40;
  if (uVar9 != 0) {
    printf("Module c14n: %d errors\n",(ulong)uVar9);
  }
  return uVar9;
}

Assistant:

static int
test_c14n(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing c14n : 3 of 4 functions ...\n");
    test_ret += test_xmlC14NDocDumpMemory();
    test_ret += test_xmlC14NDocSave();
    test_ret += test_xmlC14NDocSaveTo();
    test_ret += test_xmlC14NExecute();

    if (test_ret != 0)
	printf("Module c14n: %d errors\n", test_ret);
    return(test_ret);
}